

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QByteArray * QTzTimeZonePrivate::staticSystemTimeZoneId(void)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  ZoneNameReader *in_RDI;
  long in_FS_OFFSET;
  QByteArray *ianaId;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  QByteArray *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  ZoneNameReader *pos;
  QByteArray *in_stack_ffffffffffffffa0;
  ZoneNameReader *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->m_name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_name).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_name).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pos = in_RDI;
  this = in_RDI;
  qgetenv((char *)in_RDI);
  bVar2 = ::operator==(&in_RDI->m_name,
                       (char **)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (bVar2) {
    QByteArray::clear((QByteArray *)0x748c4a);
  }
  else {
    bVar2 = QByteArray::startsWith(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    if (bVar2) {
      QByteArray::sliced(in_stack_ffffffffffffffa0,(qsizetype)pos);
      QByteArray::operator=
                (in_stack_ffffffffffffff80,
                 (QByteArray *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QByteArray::~QByteArray((QByteArray *)0x748cbd);
    }
  }
  bVar2 = QByteArray::isEmpty((QByteArray *)0x748cc9);
  if (bVar2) {
    lVar3 = __tls_get_addr(&PTR_00bf6270);
    if (*(char *)(lVar3 + 0x99) == '\0') {
      uVar4 = __tls_get_addr(&PTR_00bf6270);
      __cxa_thread_atexit(anon_unknown.dwarf_10b2b6d::ZoneNameReader::~ZoneNameReader,uVar4,
                          &__dso_handle);
      lVar3 = __tls_get_addr(&PTR_00bf6270);
      *(undefined1 *)(lVar3 + 0x99) = 1;
    }
    __tls_get_addr(&PTR_00bf6270);
    anon_unknown.dwarf_10b2b6d::ZoneNameReader::name(this);
    QByteArray::operator=
              (in_stack_ffffffffffffff80,
               (QByteArray *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    QByteArray::~QByteArray((QByteArray *)0x748d59);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &in_RDI->m_name;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTzTimeZonePrivate::staticSystemTimeZoneId()
{
    // Check TZ env var first, if not populated try find it
    QByteArray ianaId = qgetenv("TZ");

    // The TZ value can be ":/etc/localtime" which libc considers
    // to be a "default timezone", in which case it will be read
    // by one of the blocks below, so unset it here so it is not
    // considered as a valid/found ianaId
    if (ianaId == ":/etc/localtime")
        ianaId.clear();
    else if (ianaId.startsWith(':'))
        ianaId = ianaId.sliced(1);

    if (ianaId.isEmpty()) {
        Q_CONSTINIT thread_local static ZoneNameReader reader;
        ianaId = reader.name();
    }

    return ianaId;
}